

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoringtable_test.cpp
# Opt level: O0

void __thiscall
TEST_ScoringTableTest_DealerSelfDrawn_TestShell::~TEST_ScoringTableTest_DealerSelfDrawn_TestShell
          (TEST_ScoringTableTest_DealerSelfDrawn_TestShell *this)

{
  TEST_ScoringTableTest_DealerSelfDrawn_TestShell *mem;
  TEST_ScoringTableTest_DealerSelfDrawn_TestShell *this_local;
  
  mem = this;
  ~TEST_ScoringTableTest_DealerSelfDrawn_TestShell(this);
  operator_delete(mem,(size_t)this);
  return;
}

Assistant:

TEST(ScoringTableTest, DealerSelfDrawn)
{
	CHECK_EQUAL(500, t.dealerSelfDrawn(1, 30));
	CHECK_EQUAL(700, t.dealerSelfDrawn(1, 40));
	CHECK_EQUAL(800, t.dealerSelfDrawn(1, 50));
	CHECK_EQUAL(1000, t.dealerSelfDrawn(1, 60));
	CHECK_EQUAL(1200, t.dealerSelfDrawn(1, 70));

	CHECK_EQUAL(700, t.dealerSelfDrawn(2, 20));
	CHECK_EQUAL(1000, t.dealerSelfDrawn(2, 30));
	CHECK_EQUAL(1300, t.dealerSelfDrawn(2, 40));
	CHECK_EQUAL(1600, t.dealerSelfDrawn(2, 50));
	CHECK_EQUAL(2000, t.dealerSelfDrawn(2, 60));
	CHECK_EQUAL(2300, t.dealerSelfDrawn(2, 70));

	CHECK_EQUAL(1300, t.dealerSelfDrawn(3, 20));
	CHECK_EQUAL(2000, t.dealerSelfDrawn(3, 30));
	CHECK_EQUAL(2600, t.dealerSelfDrawn(3, 40));
	CHECK_EQUAL(3200, t.dealerSelfDrawn(3, 50));
	CHECK_EQUAL(3900, t.dealerSelfDrawn(3, 60));

	CHECK_EQUAL(2600, t.dealerSelfDrawn(4, 20));
	CHECK_EQUAL(3900, t.dealerSelfDrawn(4, 30));
}